

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O2

_class * class_new(t_symbol *s,t_newmethod newmethod,t_method freemethod,size_t size,int flags,
                  t_atomtype type1,...)

{
  char *__s;
  char *__s_00;
  t_symbol *sel;
  char in_AL;
  int iVar1;
  t_gotfn p_Var2;
  size_t sVar3;
  size_t sVar4;
  _class *p_Var5;
  code *pcVar6;
  t_methodentry *ptVar7;
  uint uVar8;
  _widgetbehavior *p_Var9;
  long lVar10;
  t_atomtype *ptVar11;
  ulong uVar12;
  t_atomtype *ptVar13;
  t_atomtype tVar14;
  bool bVar15;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  t_atomtype vec [6];
  va_list ap;
  t_atomtype local_e8 [12];
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  ptVar11 = (t_atomtype *)&stack0x00000008;
  uVar8 = 0x30;
  lVar10 = 1;
  tVar14 = type1;
  do {
    vec[0] = type1;
    if (tVar14 == A_NULL) {
LAB_00165e9b:
      if (newmethod != (t_newmethod)0x0 && pd_objectmaker != (t_pd)0x0) {
        class_addmethod(pd_objectmaker,(t_method)newmethod,s,type1,(ulong)vec[1],(ulong)vec[2],
                        (ulong)vec[3],(ulong)vec[4],(ulong)vec[5]);
        sel = class_loadsym;
        if (class_loadsym != (t_symbol *)0x0 && s != (t_symbol *)0x0) {
          p_Var2 = zgetfn(&pd_objectmaker,class_loadsym);
          if (p_Var2 == (t_gotfn)0x0) {
            __s = sel->s_name;
            __s_00 = s->s_name;
            sVar3 = strlen(__s_00);
            sVar4 = strlen(__s);
            if (sVar3 <= sVar4 && sVar4 - sVar3 != 0) {
              iVar1 = strcmp(__s_00,__s + (sVar4 - sVar3));
              if (iVar1 == 0) {
                class_addmethod(pd_objectmaker,(t_method)newmethod,sel,type1,(ulong)vec[1],
                                (ulong)vec[2],(ulong)vec[3],(ulong)vec[4],(ulong)vec[5]);
              }
            }
          }
        }
      }
      uVar8 = 3;
      if ((flags & 3U) != 0) {
        uVar8 = flags & 3;
      }
      p_Var5 = (_class *)getbytes(0xa0);
      p_Var5->c_helpname = s;
      p_Var5->c_name = s;
      p_Var5->c_size = size;
      p_Var5->c_nmethod = 0;
      p_Var5->c_freemethod = freemethod;
      p_Var5->c_bangmethod = pd_defaultbang;
      p_Var5->c_pointermethod = pd_defaultpointer;
      p_Var5->c_floatmethod = pd_defaultfloat;
      p_Var5->c_symbolmethod = pd_defaultsymbol;
      p_Var5->c_listmethod = pd_defaultlist;
      p_Var5->c_anymethod = pd_defaultanything;
      p_Var5->c_pwb = (_parentwidgetbehavior *)0x0;
      p_Var5->c_firstin = (flags & 8U) == 0;
      p_Var5->c_gobj = 1 < uVar8;
      p_Var5->c_floatsignalin = 0;
      bVar15 = uVar8 == 3;
      p_Var9 = &text_widgetbehavior;
      if (!bVar15) {
        p_Var9 = (_widgetbehavior *)0x0;
      }
      p_Var5->c_wb = p_Var9;
      p_Var5->c_patchable = bVar15;
      p_Var5->c_drawcommand = '\0';
      p_Var5->c_externdir = class_extern_dir;
      pcVar6 = class_nosavefn;
      if (bVar15) {
        pcVar6 = text_save;
      }
      p_Var5->c_savefn = pcVar6;
      p_Var5->c_classfreefn = (t_classfreefn)0x0;
      ptVar7 = (t_methodentry *)getbytes(0);
      p_Var5->c_methods = ptVar7;
      return p_Var5;
    }
    if ((int)lVar10 == 6) {
      if (s == (t_symbol *)0x0) {
        pd_error((void *)0x0,"unnamed class: sorry: only %d args typechecked; use A_GIMME",5);
      }
      else {
        pd_error((void *)0x0,"class %s: sorry: only %d args typechecked; use A_GIMME",s->s_name,5);
      }
      goto LAB_00165e9b;
    }
    if (uVar8 < 0x29) {
      uVar12 = (ulong)uVar8;
      uVar8 = uVar8 + 8;
      ptVar13 = (t_atomtype *)((long)local_e8 + uVar12);
    }
    else {
      ptVar13 = ptVar11;
      ptVar11 = ptVar11 + 2;
    }
    tVar14 = *ptVar13;
    vec[lVar10] = tVar14;
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

t_class *class_new(t_symbol *s, t_newmethod newmethod, t_method freemethod,
    size_t size, int flags, t_atomtype type1, ...)
{
    va_list ap;
    t_atomtype vec[MAXPDARG+1], *vp = vec;
    int count = 0, i;
    t_class *c;
    int typeflag = flags & CLASS_TYPEMASK;
    if (!typeflag) typeflag = CLASS_PATCHABLE;
    *vp = type1;

    va_start(ap, type1);
    while (*vp)
    {
        if (count == MAXPDARG)
        {
            if (s)
                pd_error(0, "class %s: sorry: only %d args typechecked; use A_GIMME",
                      s->s_name, MAXPDARG);
            else
                pd_error(0, "unnamed class: sorry: only %d args typechecked; use A_GIMME",
                      MAXPDARG);
            break;
        }
        vp++;
        count++;
        *vp = va_arg(ap, t_atomtype);
    }
    va_end(ap);

    if (pd_objectmaker && newmethod)
    {
            /* add a "new" method by the name specified by the object */
        class_addmethod(pd_objectmaker, (t_method)newmethod, s,
            vec[0], vec[1], vec[2], vec[3], vec[4], vec[5]);
        if (s && class_loadsym && !zgetfn(&pd_objectmaker, class_loadsym))
        {
                /* if we're loading an extern it might have been invoked by a
                longer file name; in this case, make this an admissible name
                too. */
            const char *loadstring = class_loadsym->s_name;
            size_t l1 = strlen(s->s_name), l2 = strlen(loadstring);
            if (l2 > l1 && !strcmp(s->s_name, loadstring + (l2 - l1)))
                class_addmethod(pd_objectmaker, (t_method)newmethod,
                    class_loadsym,
                    vec[0], vec[1], vec[2], vec[3], vec[4], vec[5]);
        }
    }
    c = (t_class *)t_getbytes(sizeof(*c));
    c->c_name = c->c_helpname = s;
    c->c_size = size;
    c->c_nmethod = 0;
    c->c_freemethod = (t_method)freemethod;
    c->c_bangmethod = pd_defaultbang;
    c->c_pointermethod = pd_defaultpointer;
    c->c_floatmethod = pd_defaultfloat;
    c->c_symbolmethod = pd_defaultsymbol;
    c->c_listmethod = pd_defaultlist;
    c->c_anymethod = pd_defaultanything;
    c->c_wb = (typeflag == CLASS_PATCHABLE ? &text_widgetbehavior : 0);
    c->c_pwb = 0;
    c->c_firstin = ((flags & CLASS_NOINLET) == 0);
    c->c_patchable = (typeflag == CLASS_PATCHABLE);
    c->c_gobj = (typeflag >= CLASS_GOBJ);
    c->c_drawcommand = 0;
    c->c_floatsignalin = 0;
    c->c_externdir = class_extern_dir;
    c->c_savefn = (typeflag == CLASS_PATCHABLE ? text_save : class_nosavefn);
    c->c_classfreefn = 0;
#ifdef PDINSTANCE
    c->c_methods = (t_methodentry **)t_getbytes(
        pd_ninstances * sizeof(*c->c_methods));
    for (i = 0; i < pd_ninstances; i++)
        c->c_methods[i] = t_getbytes(0);
    c->c_next = class_list;
    class_list = c;
#else
    c->c_methods = t_getbytes(0);
#endif
#if 0       /* enable this if you want to see a list of all classes */
    post("class: %s", c->c_name->s_name);
#endif
    return (c);
}